

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_dns_record.c
# Opt level: O3

unsigned_short ares_dns_rr_get_u16(ares_dns_rr_t *dns_rr,ares_dns_rr_key_t key)

{
  ares_dns_datatype_t aVar1;
  unsigned_short *puVar2;
  unsigned_short uVar3;
  
  aVar1 = ares_dns_rr_key_datatype(key);
  uVar3 = 0;
  if (aVar1 == ARES_DATATYPE_U16) {
    puVar2 = (unsigned_short *)ares_dns_rr_data_ptr(dns_rr,key,(size_t **)0x0);
    uVar3 = 0;
    if (puVar2 != (unsigned_short *)0x0) {
      uVar3 = *puVar2;
    }
  }
  return uVar3;
}

Assistant:

unsigned short ares_dns_rr_get_u16(const ares_dns_rr_t *dns_rr,
                                   ares_dns_rr_key_t    key)
{
  const unsigned short *u16;

  if (ares_dns_rr_key_datatype(key) != ARES_DATATYPE_U16) {
    return 0;
  }

  u16 = ares_dns_rr_data_ptr_const(dns_rr, key, NULL);
  if (u16 == NULL) {
    return 0;
  }

  return *u16;
}